

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O1

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatrices
          (EigenDecompositionSquare<float,_1> *this,int eigenIndex,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double *categoryRates,float **transitionMatrices,int count)

{
  double dVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  int k;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  ulong local_90;
  long local_88;
  
  if (0 < count) {
    pfVar4 = this->gIMatrices[eigenIndex];
    pfVar5 = this->gEMatrices[eigenIndex];
    pfVar6 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    iVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
    local_90 = 0;
    auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      if (0 < (this->super_EigenDecomposition<float,_1>).kCategoryCount) {
        pfVar7 = transitionMatrices[probabilityIndices[local_90]];
        dVar1 = edgeLengths[local_90];
        local_88 = 0;
        iVar20 = 0;
        do {
          uVar9 = (this->super_EigenDecomposition<float,_1>).kStateCount;
          if (0 < (int)uVar9) {
            fVar23 = (float)(dVar1 * categoryRates[local_88]);
            iVar21 = 0;
            do {
              if (this->isComplex == true) {
                fVar24 = pfVar6[(long)iVar2 + (long)iVar21];
                if ((fVar24 == 0.0) && (!NAN(fVar24))) goto LAB_0013dc7f;
                iVar22 = iVar21 + 1;
                dVar26 = exp((double)(fVar23 * pfVar6[iVar21]));
                dVar25 = cos((double)(fVar23 * fVar24));
                dVar27 = sin((double)(fVar23 * fVar24));
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                if (0 < (long)iVar3) {
                  dVar25 = (double)(float)dVar26 * dVar25;
                  auVar28._0_4_ = (float)dVar25;
                  auVar28._4_4_ = (int)((ulong)dVar25 >> 0x20);
                  auVar28._8_8_ = 0;
                  fVar24 = (float)(dVar27 * (double)(float)dVar26);
                  pfVar11 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar12 = (long)(iVar3 * iVar22);
                  lVar15 = (long)(iVar21 * iVar3);
                  lVar16 = 0;
                  do {
                    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar24 * pfVar4[lVar12 + lVar16])),
                                             auVar28,ZEXT416((uint)pfVar4[lVar15 + lVar16]));
                    pfVar11[lVar15 + lVar16] = auVar8._0_4_;
                    auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar24 * pfVar4[lVar15 + lVar16])),
                                             auVar28,ZEXT416((uint)pfVar4[lVar12 + lVar16]));
                    pfVar11[lVar12 + lVar16] = auVar8._0_4_;
                    lVar16 = lVar16 + 1;
                  } while (iVar3 != lVar16);
                }
              }
              else {
LAB_0013dc7f:
                dVar25 = exp((double)(fVar23 * pfVar6[iVar21]));
                iVar3 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                iVar22 = iVar21;
                if (0 < (long)iVar3) {
                  pfVar11 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar12 = 0;
                  do {
                    pfVar11[iVar3 * iVar21 + lVar12] =
                         (float)dVar25 * pfVar4[iVar3 * iVar21 + lVar12];
                    lVar12 = lVar12 + 1;
                  } while (iVar3 != lVar12);
                }
              }
              auVar29 = ZEXT1664(ZEXT816(0) << 0x40);
              iVar21 = iVar22 + 1;
              uVar9 = (this->super_EigenDecomposition<float,_1>).kStateCount;
            } while (iVar21 < (int)uVar9);
          }
          if (0 < (int)uVar9) {
            uVar10 = (ulong)uVar9;
            uVar13 = 0;
            pfVar11 = pfVar5;
            do {
              pfVar14 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
              uVar17 = 0;
              lVar12 = (long)iVar20;
              do {
                lVar15 = lVar12;
                auVar28 = ZEXT816(0) << 0x40;
                uVar19 = 0;
                pfVar18 = pfVar14;
                do {
                  auVar28 = vfmadd231ss_fma(auVar28,ZEXT416((uint)pfVar11[uVar19]),
                                            ZEXT416((uint)*pfVar18));
                  uVar19 = uVar19 + 1;
                  pfVar18 = pfVar18 + uVar10;
                } while (uVar10 != uVar19);
                auVar28 = vmaxss_avx(auVar28,auVar29._0_16_);
                pfVar7[lVar15] = auVar28._0_4_;
                uVar17 = uVar17 + 1;
                pfVar14 = pfVar14 + 1;
                lVar12 = lVar15 + 1;
              } while (uVar17 != uVar10);
              pfVar7[(int)(lVar15 + 1)] = 1.0;
              iVar20 = (int)lVar15 + 2;
              uVar13 = uVar13 + 1;
              pfVar11 = pfVar11 + uVar10;
            } while (uVar13 != uVar10);
          }
          local_88 = local_88 + 1;
        } while (local_88 < (this->super_EigenDecomposition<float,_1>).kCategoryCount);
      }
      local_90 = local_90 + 1;
    } while (local_90 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatrices(int eigenIndex,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        const double* categoryRates,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

	const REALTYPE* Ievc = gIMatrices[eigenIndex];
	const REALTYPE* Evec = gEMatrices[eigenIndex];
	const REALTYPE* Eval = gEigenValues[eigenIndex];
	const REALTYPE* EvalImag = Eval + kStateCount;
    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
			const REALTYPE distance = categoryRates[l] * edgeLength;
        	for(int i=0; i<kStateCount; i++) {
        		if (!isComplex || EvalImag[i] == 0) {
        			const REALTYPE tmp = exp(Eval[i] * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
        			}
        		} else {
        			// 2 x 2 conjugate block
        			int i2 = i + 1;
        			const REALTYPE b = EvalImag[i];
        			const REALTYPE expat = exp(Eval[i] * distance);
        			const REALTYPE expatcosbt = expat * cos(b * distance);
        			const REALTYPE expatsinbt = expat * sin(b * distance);
        			for(int j=0; j<kStateCount; j++) {
        				matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
        						                      expatsinbt * Ievc[i2*kStateCount+j];
        				matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
												      expatsinbt * Ievc[ i*kStateCount+j];
        			}
        			i++; // processed two conjugate rows
        		}
        	}

#ifdef DEBUG_COMPLEX
           	fprintf(stderr,"[");
            	for(int i=0; i<16; i++)
            		fprintf(stderr," %7.5e,",matrixTmp[i]);
            	fprintf(stderr,"] -- complex debug\n");
            	exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
        	int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}